

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O1

char * rapidjson::internal::u64toa(uint64_t value,char *buffer)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  
  if (buffer != (char *)0x0) {
    if (value < 100000000) {
      if (value < 10000) {
        iVar2 = (int)((value & 0xffffffff) / 100);
        uVar3 = iVar2 + (int)((value & 0xffffffff) / 100);
        if (999 < value) {
          *buffer = GetDigitsLut()::cDigitsLut[uVar3];
          buffer = buffer + 1;
        }
        if (99 < value) {
          *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar3 + 1];
          buffer = buffer + 1;
        }
        uVar3 = ((int)value + iVar2 * -100) * 2;
        if (9 < value) {
          *buffer = GetDigitsLut()::cDigitsLut[uVar3];
          buffer = buffer + 1;
        }
        *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar3 + 1];
        pcVar6 = buffer + 1;
      }
      else {
        uVar5 = value & 0xffffffff;
        iVar2 = (int)(uVar5 / 10000);
        uVar3 = (int)value + iVar2 * -10000;
        uVar7 = (uint)(uVar5 / 500000) & 0xfffffffe;
        iVar4 = (int)((ulong)uVar3 * 0x28f5c29 >> 0x20);
        if (9999999 < value) {
          *buffer = GetDigitsLut()::cDigitsLut[uVar7];
          buffer = buffer + 1;
        }
        uVar9 = (ulong)(uint)(iVar4 * 2);
        uVar3 = (uVar3 + iVar4 * -100) * 2;
        if (999999 < value) {
          *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar7 + 1];
          buffer = buffer + 1;
        }
        uVar7 = (iVar2 + (int)(uVar5 / 1000000) * -100) * 2;
        if (99999 < value) {
          *buffer = GetDigitsLut()::cDigitsLut[uVar7];
          buffer = buffer + 1;
        }
        *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar7 + 1];
        buffer[1] = GetDigitsLut()::cDigitsLut[uVar9];
        buffer[2] = GetDigitsLut()::cDigitsLut[uVar9 + 1];
        buffer[3] = GetDigitsLut()::cDigitsLut[uVar3];
        buffer[4] = GetDigitsLut()::cDigitsLut[(ulong)uVar3 + 1];
        pcVar6 = buffer + 5;
      }
    }
    else if (value < 10000000000000000) {
      uVar9 = value % 100000000;
      uVar5 = value / 100000000 & 0xffffffff;
      iVar4 = (int)(uVar5 / 10000);
      uVar7 = (int)(value / 100000000) + iVar4 * -10000;
      uVar12 = (uint)(uVar5 / 500000) & 0xfffffffe;
      iVar2 = (int)(uVar9 / 10000);
      uVar3 = (int)uVar9 + iVar2 * -10000;
      if (999999999999999 < value) {
        *buffer = GetDigitsLut()::cDigitsLut[uVar12];
        buffer = buffer + 1;
      }
      if (99999999999999 < value) {
        *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar12 + 1];
        buffer = buffer + 1;
      }
      uVar12 = (iVar4 + (int)(uVar5 / 1000000) * -100) * 2;
      if (0x48c27394 < value >> 0xd) {
        *buffer = GetDigitsLut()::cDigitsLut[uVar12];
        buffer = buffer + 1;
      }
      iVar4 = (int)((ulong)uVar3 * 0x28f5c29 >> 0x20);
      if (0xe8d4a50 < value >> 0xc) {
        *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar12 + 1];
        buffer = buffer + 1;
      }
      iVar10 = (int)((ulong)uVar7 * 0x28f5c29 >> 0x20);
      uVar12 = iVar10 * 2;
      if (0x2e90edc < value >> 0xb) {
        *buffer = GetDigitsLut()::cDigitsLut[uVar12];
        buffer = buffer + 1;
      }
      uVar8 = (ulong)((uint)(uVar9 / 500000) & 0x1fe);
      uVar1 = (iVar2 + (int)(uVar9 / 1000000) * -100) * 2;
      uVar5 = (ulong)(uint)(iVar4 * 2);
      uVar3 = (uVar3 + iVar4 * -100) * 2;
      if (0x9502f8 < value >> 10) {
        *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar12 + 1];
        buffer = buffer + 1;
      }
      uVar7 = (uVar7 + iVar10 * -100) * 2;
      if (999999999 < value) {
        *buffer = GetDigitsLut()::cDigitsLut[uVar7];
        buffer = buffer + 1;
      }
      *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar7 + 1];
      buffer[1] = GetDigitsLut()::cDigitsLut[uVar8];
      buffer[2] = GetDigitsLut()::cDigitsLut[uVar8 + 1];
      buffer[3] = GetDigitsLut()::cDigitsLut[uVar1];
      buffer[4] = GetDigitsLut()::cDigitsLut[(ulong)uVar1 + 1];
      buffer[5] = GetDigitsLut()::cDigitsLut[uVar5];
      buffer[6] = GetDigitsLut()::cDigitsLut[uVar5 + 1];
      buffer[7] = GetDigitsLut()::cDigitsLut[uVar3];
      buffer[8] = GetDigitsLut()::cDigitsLut[(ulong)uVar3 + 1];
      pcVar6 = buffer + 9;
    }
    else {
      uVar5 = value / 10000000000000000;
      if (value < 100000000000000000) {
        *buffer = (byte)uVar5 | 0x30;
        pcVar6 = buffer + 1;
      }
      else if (value < 1000000000000000000) {
        *(undefined2 *)buffer = *(undefined2 *)(GetDigitsLut()::cDigitsLut + uVar5 * 2);
        pcVar6 = buffer + 2;
      }
      else if (value < 10000000000000000000) {
        *buffer = (char)(uVar5 * 0x28f5c29 >> 0x20) + '0';
        *(undefined2 *)(buffer + 1) =
             *(undefined2 *)
              (GetDigitsLut()::cDigitsLut +
              (ulong)(uint)((int)uVar5 + (int)(uVar5 / 100) * -100) * 2);
        pcVar6 = buffer + 3;
      }
      else {
        uVar9 = (ulong)(uint)((int)uVar5 + (int)(uVar5 / 100) * -100);
        *(undefined2 *)buffer = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar5 / 100) * 2);
        buffer[2] = GetDigitsLut()::cDigitsLut[uVar9 * 2];
        buffer[3] = GetDigitsLut()::cDigitsLut[(uVar9 * 2 & 0xffffffff) + 1];
        pcVar6 = buffer + 4;
      }
      uVar9 = (value % 10000000000000000) / 100000000;
      uVar5 = (value % 10000000000000000) % 100000000;
      iVar2 = (int)(uVar9 / 10000);
      uVar3 = (int)uVar9 + iVar2 * -10000;
      uVar8 = (ulong)uVar3 * 0x28f5c29;
      iVar4 = (int)(uVar5 / 10000);
      uVar7 = (int)uVar5 + iVar4 * -10000;
      uVar11 = (ulong)uVar7 * 0x28f5c29;
      *(undefined2 *)pcVar6 =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + ((uint)(uVar9 / 500000) & 0xfffffffe));
      *(undefined2 *)(pcVar6 + 2) =
           *(undefined2 *)
            (GetDigitsLut()::cDigitsLut + (ulong)(uint)(iVar2 + (int)(uVar9 / 1000000) * -100) * 2);
      *(undefined2 *)(pcVar6 + 4) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar8 >> 0x20) * 2);
      *(undefined2 *)(pcVar6 + 6) =
           *(undefined2 *)
            (GetDigitsLut()::cDigitsLut + (ulong)(uVar3 + (int)(uVar8 >> 0x20) * -100) * 2);
      *(undefined2 *)(pcVar6 + 8) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + ((uint)(uVar5 / 500000) & 0x1fe));
      *(undefined2 *)(pcVar6 + 10) =
           *(undefined2 *)
            (GetDigitsLut()::cDigitsLut + (ulong)(uint)(iVar4 + (int)(uVar5 / 1000000) * -100) * 2);
      *(undefined2 *)(pcVar6 + 0xc) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar11 >> 0x20) * 2);
      *(undefined2 *)(pcVar6 + 0xe) =
           *(undefined2 *)
            (GetDigitsLut()::cDigitsLut + (ulong)(uVar7 + (int)(uVar11 >> 0x20) * -100) * 2);
      pcVar6 = pcVar6 + 0x10;
    }
    return pcVar6;
  }
  __assert_fail("buffer != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/itoa.h"
                ,0x7f,"char *rapidjson::internal::u64toa(uint64_t, char *)");
}

Assistant:

inline char* u64toa(uint64_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);
    const char* cDigitsLut = GetDigitsLut();
    const uint64_t  kTen8 = 100000000;
    const uint64_t  kTen9 = kTen8 * 10;
    const uint64_t kTen10 = kTen8 * 100;
    const uint64_t kTen11 = kTen8 * 1000;
    const uint64_t kTen12 = kTen8 * 10000;
    const uint64_t kTen13 = kTen8 * 100000;
    const uint64_t kTen14 = kTen8 * 1000000;
    const uint64_t kTen15 = kTen8 * 10000000;
    const uint64_t kTen16 = kTen8 * kTen8;

    if (value < kTen8) {
        uint32_t v = static_cast<uint32_t>(value);
        if (v < 10000) {
            const uint32_t d1 = (v / 100) << 1;
            const uint32_t d2 = (v % 100) << 1;

            if (v >= 1000)
                *buffer++ = cDigitsLut[d1];
            if (v >= 100)
                *buffer++ = cDigitsLut[d1 + 1];
            if (v >= 10)
                *buffer++ = cDigitsLut[d2];
            *buffer++ = cDigitsLut[d2 + 1];
        }
        else {
            // value = bbbbcccc
            const uint32_t b = v / 10000;
            const uint32_t c = v % 10000;

            const uint32_t d1 = (b / 100) << 1;
            const uint32_t d2 = (b % 100) << 1;

            const uint32_t d3 = (c / 100) << 1;
            const uint32_t d4 = (c % 100) << 1;

            if (value >= 10000000)
                *buffer++ = cDigitsLut[d1];
            if (value >= 1000000)
                *buffer++ = cDigitsLut[d1 + 1];
            if (value >= 100000)
                *buffer++ = cDigitsLut[d2];
            *buffer++ = cDigitsLut[d2 + 1];

            *buffer++ = cDigitsLut[d3];
            *buffer++ = cDigitsLut[d3 + 1];
            *buffer++ = cDigitsLut[d4];
            *buffer++ = cDigitsLut[d4 + 1];
        }
    }
    else if (value < kTen16) {
        const uint32_t v0 = static_cast<uint32_t>(value / kTen8);
        const uint32_t v1 = static_cast<uint32_t>(value % kTen8);

        const uint32_t b0 = v0 / 10000;
        const uint32_t c0 = v0 % 10000;

        const uint32_t d1 = (b0 / 100) << 1;
        const uint32_t d2 = (b0 % 100) << 1;

        const uint32_t d3 = (c0 / 100) << 1;
        const uint32_t d4 = (c0 % 100) << 1;

        const uint32_t b1 = v1 / 10000;
        const uint32_t c1 = v1 % 10000;

        const uint32_t d5 = (b1 / 100) << 1;
        const uint32_t d6 = (b1 % 100) << 1;

        const uint32_t d7 = (c1 / 100) << 1;
        const uint32_t d8 = (c1 % 100) << 1;

        if (value >= kTen15)
            *buffer++ = cDigitsLut[d1];
        if (value >= kTen14)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= kTen13)
            *buffer++ = cDigitsLut[d2];
        if (value >= kTen12)
            *buffer++ = cDigitsLut[d2 + 1];
        if (value >= kTen11)
            *buffer++ = cDigitsLut[d3];
        if (value >= kTen10)
            *buffer++ = cDigitsLut[d3 + 1];
        if (value >= kTen9)
            *buffer++ = cDigitsLut[d4];

        *buffer++ = cDigitsLut[d4 + 1];
        *buffer++ = cDigitsLut[d5];
        *buffer++ = cDigitsLut[d5 + 1];
        *buffer++ = cDigitsLut[d6];
        *buffer++ = cDigitsLut[d6 + 1];
        *buffer++ = cDigitsLut[d7];
        *buffer++ = cDigitsLut[d7 + 1];
        *buffer++ = cDigitsLut[d8];
        *buffer++ = cDigitsLut[d8 + 1];
    }
    else {
        const uint32_t a = static_cast<uint32_t>(value / kTen16); // 1 to 1844
        value %= kTen16;

        if (a < 10)
            *buffer++ = static_cast<char>('0' + static_cast<char>(a));
        else if (a < 100) {
            const uint32_t i = a << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else if (a < 1000) {
            *buffer++ = static_cast<char>('0' + static_cast<char>(a / 100));

            const uint32_t i = (a % 100) << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else {
            const uint32_t i = (a / 100) << 1;
            const uint32_t j = (a % 100) << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
            *buffer++ = cDigitsLut[j];
            *buffer++ = cDigitsLut[j + 1];
        }

        const uint32_t v0 = static_cast<uint32_t>(value / kTen8);
        const uint32_t v1 = static_cast<uint32_t>(value % kTen8);

        const uint32_t b0 = v0 / 10000;
        const uint32_t c0 = v0 % 10000;

        const uint32_t d1 = (b0 / 100) << 1;
        const uint32_t d2 = (b0 % 100) << 1;

        const uint32_t d3 = (c0 / 100) << 1;
        const uint32_t d4 = (c0 % 100) << 1;

        const uint32_t b1 = v1 / 10000;
        const uint32_t c1 = v1 % 10000;

        const uint32_t d5 = (b1 / 100) << 1;
        const uint32_t d6 = (b1 % 100) << 1;

        const uint32_t d7 = (c1 / 100) << 1;
        const uint32_t d8 = (c1 % 100) << 1;

        *buffer++ = cDigitsLut[d1];
        *buffer++ = cDigitsLut[d1 + 1];
        *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
        *buffer++ = cDigitsLut[d5];
        *buffer++ = cDigitsLut[d5 + 1];
        *buffer++ = cDigitsLut[d6];
        *buffer++ = cDigitsLut[d6 + 1];
        *buffer++ = cDigitsLut[d7];
        *buffer++ = cDigitsLut[d7 + 1];
        *buffer++ = cDigitsLut[d8];
        *buffer++ = cDigitsLut[d8 + 1];
    }

    return buffer;
}